

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O3

void compare_functions(vector<t_function_*,_std::allocator<t_function_*>_> *newFunctionList,
                      vector<t_function_*,_std::allocator<t_function_*>_> *oldFunctionList)

{
  string *__k;
  _Rb_tree_header *p_Var1;
  pointer pptVar2;
  mapped_type ptVar3;
  t_function *oldFunction;
  mapped_type *pptVar4;
  iterator iVar5;
  pointer pptVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
  newFunctionMap;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pptVar6 = (newFunctionList->super__Vector_base<t_function_*,_std::allocator<t_function_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pptVar2 = (newFunctionList->super__Vector_base<t_function_*,_std::allocator<t_function_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (pptVar6 != pptVar2) {
    do {
      ptVar3 = *pptVar6;
      pptVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
                              *)&local_60,&ptVar3->name_);
      *pptVar4 = ptVar3;
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 != pptVar2);
  }
  pptVar6 = (oldFunctionList->super__Vector_base<t_function_*,_std::allocator<t_function_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pptVar2 = (oldFunctionList->super__Vector_base<t_function_*,_std::allocator<t_function_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (pptVar6 != pptVar2) {
    do {
      oldFunction = *pptVar6;
      __k = &oldFunction->name_;
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
              ::find(&local_60,__k);
      if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
        thrift_audit_failure("New Thrift File has missing function %s\n",(__k->_M_dataplus)._M_p);
      }
      else {
        compare_single_function(*(t_function **)(iVar5._M_node + 2),oldFunction);
      }
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 != pptVar2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void compare_functions(const std::vector<t_function*>& newFunctionList, const std::vector<t_function*>& oldFunctionList)
{
   std::map<std::string, t_function*> newFunctionMap;
   std::map<std::string, t_function*>::iterator newFunctionMapIt;
   for(auto newFunctionIt : newFunctionList)
   {
      newFunctionMap[newFunctionIt->get_name()] = newFunctionIt;
   }

   for(auto oldFunctionIt : oldFunctionList)
   {
      newFunctionMapIt = newFunctionMap.find(oldFunctionIt->get_name());
      if(newFunctionMapIt == newFunctionMap.end())
      {
         thrift_audit_failure("New Thrift File has missing function %s\n",oldFunctionIt->get_name().c_str());
         continue;
      }
      else
      {
         //Function is found in both thrift files. Compare return type and argument list
         compare_single_function(newFunctionMapIt->second, oldFunctionIt);
      }
   }

}